

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Vfs_touch(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  jx9_int64 jVar4;
  jx9_int64 jVar5;
  uint iBool;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pvVar1 = pCtx->pFunc->pUserData;
    if ((pvVar1 != (void *)0x0) && (*(long *)((long)pvVar1 + 0x100) != 0)) {
      pcVar3 = jx9_value_to_string(*apArg,(int *)0x0);
      if (nArg == 1) {
        jVar4 = -1;
        jVar5 = jVar4;
      }
      else {
        jVar4 = jx9_value_to_int64(apArg[1]);
        jVar5 = jVar4;
        if (2 < (uint)nArg) {
          jVar5 = jx9_value_to_int64(apArg[1]);
        }
      }
      iVar2 = (**(code **)((long)pvVar1 + 0x100))(pcVar3,jVar4,jVar5);
      iBool = (uint)(iVar2 == 0);
      goto LAB_00133bc3;
    }
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString);
  }
  iBool = 0;
LAB_00133bc3:
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int jx9Vfs_touch(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_int64 nTime, nAccess;
	const char *zFile;
	jx9_vfs *pVfs;
	int rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xTouch == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nTime = nAccess = -1;
	zFile = jx9_value_to_string(apArg[0], 0);
	if( nArg > 1 ){
		nTime = jx9_value_to_int64(apArg[1]);
		if( nArg > 2 ){
			nAccess = jx9_value_to_int64(apArg[1]);
		}else{
			nAccess = nTime;
		}
	}
	rc = pVfs->xTouch(zFile, nTime, nAccess);
	/* IO result */
	jx9_result_bool(pCtx, rc == JX9_OK);
	return JX9_OK;
}